

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O3

void Wlc_NtkPrintInvStats(Wlc_Ntk_t *pNtk,Vec_Int_t *vCounts,int fVerbose)

{
  int iObj;
  Wlc_Obj_t *pWVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar11;
  ulong uVar12;
  int iVar10;
  
  iVar2 = (pNtk->vCis).nSize;
  if (iVar2 < 1) {
    uVar11 = 0;
  }
  else {
    lVar8 = 0;
    uVar11 = 0;
    do {
      iObj = (pNtk->vCis).pArray[lVar8];
      lVar6 = (long)iObj;
      if ((lVar6 < 1) || (pNtk->nObjsAlloc <= iObj)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar1 = pNtk->pObjs;
      if ((undefined1  [24])((undefined1  [24])pWVar1[lVar6] & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x3) {
        iVar4 = pWVar1[lVar6].End - pWVar1[lVar6].Beg;
        iVar10 = -iVar4;
        if (0 < iVar4) {
          iVar10 = iVar4;
        }
        uVar9 = iVar10 + 1;
        uVar12 = (ulong)uVar9;
        uVar7 = (ulong)uVar11;
        uVar5 = 0;
        do {
          if ((long)vCounts->nSize <= (long)(uVar7 + uVar5)) goto LAB_00899cfa;
        } while ((vCounts->pArray[uVar7 + uVar5] == 0) && (uVar5 = uVar5 + 1, uVar12 != uVar5));
        if (uVar9 != (uint)uVar5) {
          pcVar3 = Wlc_ObjName(pNtk,iObj);
          uVar5 = 0;
          printf("%s[%d:%d] : ",pcVar3,(ulong)(uint)pWVar1[lVar6].End,(ulong)(uint)pWVar1[lVar6].Beg
                );
          do {
            if (vCounts->nSize <= (int)uVar7) {
LAB_00899cfa:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (vCounts->pArray[uVar7] != 0) {
              printf("  [%d] -> %d",uVar5);
            }
            uVar5 = (ulong)((int)uVar5 + 1);
            uVar7 = uVar7 + 1;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
          putchar(10);
          iVar2 = (pNtk->vCis).nSize;
        }
        uVar11 = uVar9 + uVar11;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar2);
  }
  if (vCounts->nSize != uVar11) {
    __assert_fail("Vec_IntSize(vCounts) == nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbc.c"
                  ,0x81,"void Wlc_NtkPrintInvStats(Wlc_Ntk_t *, Vec_Int_t *, int)");
  }
  return;
}

Assistant:

void Wlc_NtkPrintInvStats( Wlc_Ntk_t * pNtk, Vec_Int_t * vCounts, int fVerbose )
{
    Wlc_Obj_t * pObj;
    int i, k, nNum, nRange, nBits = 0;
    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( pObj->Type != WLC_OBJ_FO )
            continue;
        nRange = Wlc_ObjRange(pObj);
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry(vCounts, nBits + k);
            if ( nNum )
                break;
        }
        if ( k == nRange )
        {
            nBits += nRange;
            continue;
        }
        printf( "%s[%d:%d] : ", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), pObj->End, pObj->Beg );
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry( vCounts, nBits + k );
            if ( nNum == 0 )
                continue;
            printf( "  [%d] -> %d", k, nNum );
        }
        printf( "\n");
        nBits += nRange;
    }
    //printf( "%d %d\n", Vec_IntSize(vCounts), nBits );
    assert( Vec_IntSize(vCounts) == nBits );
}